

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransform2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  TransformNode *pTVar1;
  GroupNode *pGVar2;
  long *in_RDX;
  ulong uVar3;
  XMLLoader *this_00;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *this_01;
  AffineSpace3fa space1;
  AffineSpace3fa space0;
  _Alloc_hider local_d0;
  GroupNode *local_c8;
  undefined1 local_c0 [72];
  AffineSpace3fa local_78;
  
  this_00 = (XMLLoader *)xml;
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (&local_78,(XMLLoader *)xml,*(Ref<embree::XML> **)(*in_RDX + 0x80));
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)(local_c0 + 8),this_00,
             (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + 8));
  if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) == 0x18) {
    pTVar1 = (TransformNode *)alignedMalloc(0xa0,0x10);
    loadNode((XMLLoader *)&local_d0,xml);
    SceneGraph::TransformNode::TransformNode
              (pTVar1,&local_78,(AffineSpace3fa *)(local_c0 + 8),
               (Ref<embree::SceneGraph::Node> *)&local_d0);
    (this->path).filename._M_dataplus._M_p = (pointer)pTVar1;
    (**(code **)((long)(pTVar1->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar1);
    if ((long *)local_d0._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_d0._M_p + 0x18))();
    }
  }
  else {
    local_c0._0_8_ = this;
    pGVar2 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(pGVar2,0);
    local_c8 = pGVar2;
    (*(pGVar2->super_Node).super_RefCount._vptr_RefCount[2])(pGVar2);
    if (0x10 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80))) {
      this_01 = &local_c8->children;
      uVar3 = 2;
      do {
        loadNode((XMLLoader *)&local_d0,xml);
        if ((long *)local_d0._M_p != (long *)0x0) {
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(this_01,(value_type *)&local_d0);
          if ((long *)local_d0._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_d0._M_p + 0x18))();
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
    }
    pTVar1 = (TransformNode *)alignedMalloc(0xa0,0x10);
    pGVar2 = local_c8;
    local_d0._M_p = (pointer)local_c8;
    (*(local_c8->super_Node).super_RefCount._vptr_RefCount[2])(local_c8);
    this = (XMLLoader *)local_c0._0_8_;
    SceneGraph::TransformNode::TransformNode
              (pTVar1,&local_78,(AffineSpace3fa *)(local_c0 + 8),
               (Ref<embree::SceneGraph::Node> *)&local_d0);
    *(TransformNode **)this = pTVar1;
    (*(pTVar1->super_Node).super_RefCount._vptr_RefCount[2])(pTVar1);
    if ((GroupNode *)local_d0._M_p != (GroupNode *)0x0) {
      (**(code **)(*(long *)local_d0._M_p + 0x18))();
    }
    (*(pGVar2->super_Node).super_RefCount._vptr_RefCount[3])(pGVar2);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransform2Node(const Ref<XML>& xml) 
  {
    AffineSpace3fa space0 = load<AffineSpace3fa>(xml->children[0]);
    AffineSpace3fa space1 = load<AffineSpace3fa>(xml->children[1]);

    if (xml->size() == 3)
      return new SceneGraph::TransformNode(space0,space1,loadNode(xml->children[2]));
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=2; i<xml->size(); i++) 
      group->add(loadNode(xml->children[i]));

    return new SceneGraph::TransformNode(space0,space1,group.cast<SceneGraph::Node>());
  }